

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O2

uint32_t __thiscall cfd::Psbt::GetTxInIndex(Psbt *this,OutPoint *outpoint)

{
  uint32_t uVar1;
  Txid local_30;
  
  cfd::core::OutPoint::GetTxid();
  cfd::core::OutPoint::GetVout();
  uVar1 = cfd::core::Transaction::GetTxInIndex((Txid *)&this->field_0x10,(uint)&local_30);
  core::Txid::~Txid(&local_30);
  return uVar1;
}

Assistant:

uint32_t Psbt::GetTxInIndex(const OutPoint& outpoint) const {
  return base_tx_.GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
}